

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaWorker.cpp
# Opt level: O0

void __thiscall xmrig::CudaWorker::start(CudaWorker *this)

{
  bool bVar1;
  uint uVar2;
  uint64_t uVar3;
  uint32_t *puVar4;
  WorkerJob<1UL> *in_RDI;
  size_t batch_size;
  uint32_t foundCount;
  uint32_t foundNonce [10];
  CudaWorker *in_stack_000000c8;
  uint8_t *in_stack_ffffffffffffff88;
  CudaWorker *this_00;
  uint32_t in_stack_ffffffffffffff98;
  Backend in_stack_ffffffffffffff9c;
  undefined8 in_stack_ffffffffffffffa8;
  int local_4c;
  undefined1 local_48 [8];
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_ffffffffffffffc0;
  int local_14;
  duration<long,std::ratio<1l,1000l>> local_10 [16];
  
  do {
    uVar3 = Nonce::sequence(in_stack_ffffffffffffff9c);
    if (uVar3 == 0) {
      return;
    }
    bVar1 = isReady();
    if (!bVar1) {
      do {
        local_14 = 200;
        std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_10,&local_14);
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(in_stack_ffffffffffffffc0);
        bVar1 = isReady();
        in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c & 0xffffff;
        if (!bVar1) {
          uVar3 = Nonce::sequence(in_stack_ffffffffffffff9c);
          in_stack_ffffffffffffff9c = CONCAT13(uVar3 != 0,(int3)in_stack_ffffffffffffff9c);
        }
      } while ((char)(in_stack_ffffffffffffff9c >> 0x18) != '\0');
      uVar3 = Nonce::sequence(in_stack_ffffffffffffff9c);
      if (uVar3 == 0) {
        return;
      }
      bVar1 = consumeJob(in_stack_000000c8);
      if (!bVar1) {
        return;
      }
    }
    while( true ) {
      WorkerJob<1UL>::sequence((WorkerJob<1UL> *)(in_RDI->m_blobs[0] + 0x50));
      bVar1 = Nonce::isOutdated((Backend)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(uint64_t)in_RDI
                               );
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      memset(local_48,0,0x28);
      local_4c = 0;
      this_00 = *(CudaWorker **)(in_RDI->m_blobs[0] + 0x40);
      puVar4 = WorkerJob<1UL>::nonce((WorkerJob<1UL> *)this_00,(size_t)in_stack_ffffffffffffff88);
      uVar2 = (*(this_00->super_Worker).super_IWorker._vptr_IWorker[4])
                        (this_00,(ulong)*puVar4,&local_4c,local_48);
      if ((uVar2 & 1) == 0) {
        return;
      }
      if (local_4c != 0) {
        WorkerJob<1UL>::currentJob((WorkerJob<1UL> *)this_00);
        JobResults::submit((Job *)this_00,(uint32_t *)in_stack_ffffffffffffff88,0x229560);
      }
      in_stack_ffffffffffffffa8 = (**(code **)(*(long *)in_RDI->m_blobs[0] + 0x28))();
      in_stack_ffffffffffffff88 = in_RDI->m_blobs[0] + 0x50;
      roundSize((uint32_t)in_stack_ffffffffffffffa8);
      WorkerJob<1UL>::nextRound(in_RDI,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
      storeStats(this_00);
      std::this_thread::yield();
    }
    bVar1 = consumeJob(in_stack_000000c8);
    if (!bVar1) {
      return;
    }
  } while( true );
}

Assistant:

void xmrig::CudaWorker::start()
{
    while (Nonce::sequence(Nonce::CUDA) > 0) {
        if (!isReady()) {
            do {
                std::this_thread::sleep_for(std::chrono::milliseconds(200));
            }
            while (!isReady() && Nonce::sequence(Nonce::CUDA) > 0);

            if (Nonce::sequence(Nonce::CUDA) == 0) {
                break;
            }

            if (!consumeJob()) {
                return;
            }
        }

        while (!Nonce::isOutdated(Nonce::CUDA, m_job.sequence())) {
            uint32_t foundNonce[10] = { 0 };
            uint32_t foundCount     = 0;

            if (!m_runner->run(*m_job.nonce(), &foundCount, foundNonce)) {
                return;
            }

            if (foundCount) {
                JobResults::submit(m_job.currentJob(), foundNonce, foundCount);
            }

            const size_t batch_size = intensity();
            m_job.nextRound(roundSize(batch_size), batch_size);

            storeStats();
            std::this_thread::yield();
        }

        if (!consumeJob()) {
            return;
        }
    }
}